

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O0

void google::protobuf::DoubleValue::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  DoubleValue **v1;
  DoubleValue **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  uint32_t *puVar3;
  unsigned_long uVar4;
  double local_68;
  uint local_60;
  uint32_t cached_has_bits;
  LogMessage local_50;
  Voidify local_39;
  DoubleValue *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  DoubleValue *from;
  DoubleValue *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (DoubleValue *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (DoubleValue *)to_msg;
  _this = (DoubleValue *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::DoubleValue_const*>
                 (&local_38);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::DoubleValue*>
                 (&from);
  local_30 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::DoubleValue_const*,google::protobuf::DoubleValue*>
                       (v1,v2,"&from != _this");
  if (local_30 == (Nullable<const_char_*>)0x0) {
    local_60 = 0;
    puVar3 = internal::HasBits<1>::operator[]
                       ((HasBits<1> *)(absl_log_internal_check_op_result + 0x10),0);
    local_60 = *puVar3;
    if ((local_60 & 1) != 0) {
      local_68 = _internal_value((DoubleValue *)absl_log_internal_check_op_result);
      uVar4 = absl::lts_20250127::bit_cast<unsigned_long,_double,_0>(&local_68);
      if (uVar4 != 0) {
        (from->field_0)._impl_.value_ = *(double *)(absl_log_internal_check_op_result + 0x18);
      }
    }
    uVar1 = local_60;
    puVar3 = internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
    *puVar3 = uVar1 | *puVar3;
    internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(from->super_Message).super_MessageLite._internal_metadata_,
               (InternalMetadata *)(absl_log_internal_check_op_result + 8));
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wrappers.pb.cc"
             ,0x23d,failure_msg);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_50);
}

Assistant:

void DoubleValue::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<DoubleValue*>(&to_msg);
  auto& from = static_cast<const DoubleValue&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.DoubleValue)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    if (::absl::bit_cast<::uint64_t>(from._internal_value()) != 0) {
      _this->_impl_.value_ = from._impl_.value_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}